

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

int32_t ra_spill(ASMState *as,IRIns *ir)

{
  TraceError e;
  jit_State *in_RSI;
  long in_RDI;
  int32_t slot;
  
  e = (TraceError)(in_RSI->cur).linktype;
  if (e == LJ_TRERR_RECERR) {
    if ((0x604208U >> ((in_RSI->cur).marked & 0x1f) & 1) == 0) {
      if (*(int *)(in_RDI + 0xc4) == 0) {
        e = *(TraceError *)(in_RDI + 0xc0);
        *(TraceError *)(in_RDI + 0xc4) = e + LJ_TRERR_TRACEOV;
        *(int *)(in_RDI + 0xc0) = *(int *)(in_RDI + 0xc0) + 2;
      }
      else {
        e = *(TraceError *)(in_RDI + 0xc4);
        *(undefined4 *)(in_RDI + 0xc4) = 0;
      }
    }
    else {
      e = *(TraceError *)(in_RDI + 0xc0);
      *(int *)(in_RDI + 0xc0) = *(int *)(in_RDI + 0xc0) + 2;
    }
    if (0x100 < *(int *)(in_RDI + 0xc0)) {
      lj_trace_err(in_RSI,e);
    }
    (in_RSI->cur).linktype = (uint8_t)e;
  }
  return e << 2;
}

Assistant:

static int32_t ra_spill(ASMState *as, IRIns *ir)
{
  int32_t slot = ir->s;
  lua_assert(ir >= as->ir + REF_TRUE);
  if (!ra_hasspill(slot)) {
    if (irt_is64(ir->t)) {
      slot = as->evenspill;
      as->evenspill += 2;
    } else if (as->oddspill) {
      slot = as->oddspill;
      as->oddspill = 0;
    } else {
      slot = as->evenspill;
      as->oddspill = slot+1;
      as->evenspill += 2;
    }
    if (as->evenspill > 256)
      lj_trace_err(as->J, LJ_TRERR_SPILLOV);
    ir->s = (uint8_t)slot;
  }
  return sps_scale(slot);
}